

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O1

Aig_Obj_t * Saig_BmcObjFrame(Saig_Bmc_t *p,Aig_Obj_t *pObj,int i)

{
  uint uVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  long lVar5;
  
  if ((-1 < i) && (i < p->vAig2Frm->nSize)) {
    lVar5 = (long)pObj->Id;
    if ((lVar5 < 0) ||
       (pvVar4 = p->vAig2Frm->pArray[(uint)i], *(int *)((long)pvVar4 + 4) <= pObj->Id)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    lVar2 = *(long *)((long)pvVar4 + 8);
    uVar1 = *(uint *)(lVar2 + lVar5 * 4);
    if (uVar1 != 0xffffffff) {
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      pVVar3 = p->pFrm->vObjs;
      if (pVVar3 == (Vec_Ptr_t *)0x0) {
        pvVar4 = (void *)0x0;
      }
      else {
        if (pVVar3->nSize <= (int)(uVar1 >> 1)) goto LAB_004e970c;
        pvVar4 = pVVar3->pArray[uVar1 >> 1];
      }
      if (pvVar4 != (void *)0x0) {
        return (Aig_Obj_t *)((ulong)pvVar4 ^ (ulong)(uVar1 & 1));
      }
      *(undefined4 *)(lVar2 + lVar5 * 4) = 0xffffffff;
    }
    return (Aig_Obj_t *)0x0;
  }
LAB_004e970c:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

static inline Aig_Obj_t * Saig_BmcObjFrame( Saig_Bmc_t * p, Aig_Obj_t * pObj, int i )                       
{ 
//    return (Aig_Obj_t *)Vec_PtrGetEntry( p->vAig2Frm, p->nObjs*i+pObj->Id );     
    Aig_Obj_t * pRes;
    Vec_Int_t * vFrame = (Vec_Int_t *)Vec_PtrEntry( p->vAig2Frm, i );
    int iObjLit = Vec_IntEntry( vFrame, Aig_ObjId(pObj) );
    if ( iObjLit == -1 )
        return NULL;
    pRes = Aig_ManObj( p->pFrm, Abc_Lit2Var(iObjLit) );
    if ( pRes == NULL )
        Vec_IntWriteEntry( vFrame, Aig_ObjId(pObj), -1 );
    else
        pRes = Aig_NotCond( pRes, Abc_LitIsCompl(iObjLit) );
    return pRes;
}